

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_materialized_cte.hpp
# Opt level: O1

void __thiscall
duckdb::LogicalMaterializedCTE::~LogicalMaterializedCTE(LogicalMaterializedCTE *this)

{
  pointer pcVar1;
  
  (this->super_LogicalCTE).super_LogicalOperator._vptr_LogicalOperator =
       (_func_int **)&PTR__LogicalCTE_02490f40;
  ::std::vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>::
  ~vector(&(this->super_LogicalCTE).correlated_columns.
           super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
         );
  pcVar1 = (this->super_LogicalCTE).ctename._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_LogicalCTE).ctename.field_2) {
    operator_delete(pcVar1);
  }
  LogicalOperator::~LogicalOperator((LogicalOperator *)this);
  operator_delete(this);
  return;
}

Assistant:

explicit LogicalMaterializedCTE() : LogicalCTE(LogicalOperatorType::LOGICAL_MATERIALIZED_CTE) {
	}